

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O3

void __thiscall OmegaSN::algoISOTONIC(OmegaSN *this,vector<double,_std::allocator<double>_> *data)

{
  pointer pdVar1;
  pointer pdVar2;
  double **ppdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint u;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  double dVar13;
  uint local_7c;
  Costs cost;
  uint local_74;
  OmegaSN *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  double local_40;
  double local_38;
  
  pdVar1 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (ulong)this->nbStates;
  Costs::Costs(&cost);
  ppdVar3 = preprocessing(this,data);
  this->S12P = ppdVar3;
  local_70 = this;
  Q0init(this,data);
  uVar10 = (int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3) + 1;
  local_58 = (ulong)uVar10;
  local_7c = 2;
  if (2 < uVar10) {
    uVar10 = local_70->nbSegments;
    local_50 = uVar8;
    do {
      if (1 < uVar10) {
        uVar6 = 1;
        do {
          uVar7 = uVar6 + 1;
          if (uVar8 != 0) {
            local_60 = 1;
            local_68 = 0;
            local_48 = uVar7;
            do {
              local_74 = (uint)uVar7;
              uVar5 = (ulong)local_7c;
              uVar10 = 0;
              dVar13 = INFINITY;
              uVar11 = 0;
              if (uVar7 < uVar5) {
                uVar9 = 0;
                uVar4 = uVar7 & 0xffffffff;
                uVar12 = 0;
                uVar10 = 0;
                dVar13 = INFINITY;
                do {
                  do {
                    local_40 = local_70->Q[uVar6 - 1][uVar9][uVar4];
                    ppdVar3 = local_70->S12P;
                    uVar8 = (ulong)local_7c;
                    local_38 = dVar13;
                    dVar13 = Costs::slopeCost(&cost,local_70->states + uVar9,
                                              local_70->states + local_68,&local_74,&local_7c,
                                              *ppdVar3 + uVar4,*ppdVar3 + uVar8,ppdVar3[1] + uVar4,
                                              ppdVar3[1] + uVar8,ppdVar3[2] + uVar4,
                                              ppdVar3[2] + uVar8);
                    dVar13 = dVar13 + local_40;
                    uVar4 = (ulong)local_74;
                    if (dVar13 < local_38) {
                      uVar12 = uVar9 & 0xffffffff;
                      uVar10 = local_74;
                    }
                    uVar11 = (uint)uVar12;
                    if (local_38 <= dVar13) {
                      dVar13 = local_38;
                    }
                    uVar9 = uVar9 + 1;
                  } while (uVar9 != local_60);
                  uVar5 = (ulong)local_7c;
                  local_74 = local_74 + 1;
                  uVar4 = (ulong)local_74;
                  uVar9 = 0;
                  uVar7 = local_48;
                  uVar8 = local_50;
                } while (local_74 < local_7c);
              }
              local_70->Q[uVar6][local_68][uVar5] = dVar13;
              local_70->lastChpt[uVar6][local_68][uVar5] = uVar10;
              local_70->lastIndState[uVar6][local_68][local_7c] = uVar11;
              local_68 = local_68 + 1;
              local_60 = local_60 + 1;
            } while (local_68 != uVar8);
            uVar10 = local_70->nbSegments;
          }
          uVar6 = uVar7;
        } while (uVar6 < uVar10);
      }
      local_7c = local_7c + 1;
    } while (local_7c < (uint)local_58);
  }
  local_70->pruning = 1.0;
  return;
}

Assistant:

void OmegaSN::algoISOTONIC(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);
  Q0init(data);

  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int nb = 1; nb < nbSegments; nb++)
    {
      for(unsigned int v = 0; v < p; v++)
      {
        ///// EXPLORE MATRIX size p*T
        temp_Q = INFINITY;
        temp_indState = 0;
        temp_chpt = 0;

        for(unsigned int t = nb + 1; t < T; t++)
        {
          for(unsigned int u = 0; u < (v + 1); u++) /////explore column of states
          {
            temp_cost = Q[nb-1][u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]);
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
        }
        ///// Write response
        Q[nb][v][T] = temp_Q;
        lastChpt[nb][v][T] = temp_chpt;
        lastIndState[nb][v][T] = temp_indState;
        //std::cout << "nb " << nb << " v "<< v << " T " << T << " Q " << temp_Q << " --- " << temp_indState << " && " << temp_chpt << std::endl;
      }
    }
  }
  pruning = 1;

}